

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

VkShaderModule createShaderModule(Init *init,vector<char,_std::allocator<char>_> *code)

{
  VkResult VVar1;
  Init *local_50;
  VkShaderModule shaderModule;
  VkShaderModuleCreateInfo create_info;
  vector<char,_std::allocator<char>_> *code_local;
  Init *init_local;
  
  create_info.pCode = (uint32_t *)code;
  memset(&shaderModule,0,0x28);
  shaderModule._0_4_ = 0x10;
  create_info._16_8_ =
       std::vector<char,_std::allocator<char>_>::size
                 ((vector<char,_std::allocator<char>_> *)create_info.pCode);
  create_info.codeSize =
       (size_t)std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)create_info.pCode);
  VVar1 = vkb::DispatchTable::createShaderModule
                    (&init->disp,(VkShaderModuleCreateInfo *)&shaderModule,
                     (VkAllocationCallbacks *)0x0,(VkShaderModule *)&local_50);
  if (VVar1 == VK_SUCCESS) {
    init_local = local_50;
  }
  else {
    init_local = (Init *)0x0;
  }
  return (VkShaderModule)init_local;
}

Assistant:

VkShaderModule createShaderModule(Init& init, const std::vector<char>& code) {
    VkShaderModuleCreateInfo create_info = {};
    create_info.sType = VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO;
    create_info.codeSize = code.size();
    create_info.pCode = reinterpret_cast<const uint32_t*>(code.data());

    VkShaderModule shaderModule;
    if (init.disp.createShaderModule(&create_info, nullptr, &shaderModule) != VK_SUCCESS) {
        return VK_NULL_HANDLE; // failed to create shader module
    }

    return shaderModule;
}